

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Commands.cpp
# Opt level: O3

void __thiscall RCONConsoleCommand::trigger(RCONConsoleCommand *this,string_view parameters)

{
  const_iterator __begin1;
  undefined8 *puVar1;
  undefined8 *local_38;
  undefined8 *local_30;
  long local_28;
  
  if (parameters._M_len == 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Error: Too Few Parameters. Syntax: rcon <input>",0x2f);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x10);
    std::ostream::put(-0x10);
    std::ostream::flush();
  }
  RenX::getCore();
  RenX::Core::getServers();
  puVar1 = local_38;
  if (local_38 == local_30) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Error: Not connected to any Renegade X servers.",0x2f);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x10);
    std::ostream::put(-0x10);
    std::ostream::flush();
  }
  else {
    do {
      RenX::Server::send(*puVar1,parameters._M_len,parameters._M_str);
      puVar1 = puVar1 + 1;
    } while (puVar1 != local_30);
  }
  if (local_38 != (undefined8 *)0x0) {
    operator_delete(local_38,local_28 - (long)local_38);
  }
  return;
}

Assistant:

void RCONConsoleCommand::trigger(std::string_view parameters) {
	if (parameters.empty()) {
		std::cout << "Error: Too Few Parameters. Syntax: rcon <input>" << std::endl;
	}

	const auto& servers = RenX::getCore()->getServers();
	if (servers.empty()) {
		std::cout << "Error: Not connected to any Renegade X servers." << std::endl;
		return;
	}

	for (const auto& server : servers) {
		server->send(parameters);
	}
}